

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void __thiscall AMColorset::initFromCVars(AMColorset *this,FColorCVar **values)

{
  FColorCVar *pFVar1;
  uint r;
  int i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  for (lVar2 = 0; lVar2 != 0x17; lVar2 = lVar2 + 1) {
    pFVar1 = values[lVar2];
    this->c[lVar2].Index = pFVar1->Index;
    this->c[lVar2].RGB = (pFVar1->super_FIntCVar).Value | 0xff000000;
  }
  uVar3 = ((*values)->super_FIntCVar).Value;
  uVar5 = uVar3 >> 0x10 & 0xff;
  uVar4 = uVar3 >> 8 & 0xff;
  uVar3 = uVar3 & 0xff;
  r = uVar5 - 0x10;
  if (uVar5 < 0x10) {
    r = uVar5 | 0x10;
  }
  uVar5 = uVar4 - 0x10;
  if (uVar4 < 0x10) {
    uVar5 = uVar4 | 0x10;
  }
  uVar4 = uVar3 - 0x10;
  if (uVar3 < 0x10) {
    uVar4 = uVar3 | 0x10;
  }
  AMColor::FromRGB(this->c + 0x17,r,uVar5,uVar4);
  this->displayLocks = true;
  this->forcebackground = false;
  return;
}

Assistant:

void initFromCVars(FColorCVar **values)
	{
		for(int i=0;i<AlmostBackgroundColor; i++)
		{
			c[i].FromCVar(*values[i]);
		}

		DWORD ba = *(values[0]);

		int r = RPART(ba) - 16;
		int g = GPART(ba) - 16;
		int b = BPART(ba) - 16;

		if (r < 0)
			r += 32;
		if (g < 0)
			g += 32;
		if (b < 0)
			b += 32;

		c[AlmostBackgroundColor].FromRGB(r, g, b);
		displayLocks = true;
		forcebackground = false;
	}